

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,position_t *pos,string *what_arg)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_t sVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  long *plVar7;
  ulong uVar8;
  undefined8 uVar9;
  string w;
  ulong *local_110;
  position_t *local_108;
  ulong local_100;
  long lStack_f8;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"parse_error","");
  exception::name(&local_50,&local_70,id_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_110 = &local_100;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_100 = *puVar6;
    lStack_f8 = plVar4[3];
  }
  else {
    local_100 = *puVar6;
    local_110 = (ulong *)*plVar4;
  }
  local_108 = (position_t *)plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  position_string_abi_cxx11_(&local_d0,(parse_error *)pos,local_108);
  uVar2 = (long)&local_108->chars_read_total + local_d0._M_string_length;
  uVar8 = 0xf;
  if (local_110 != &local_100) {
    uVar8 = local_100;
  }
  if (uVar8 < uVar2) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar9 = local_d0.field_2._M_allocated_capacity;
    }
    if (uVar2 <= (ulong)uVar9) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_110);
      goto LAB_00137a31;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_d0._M_dataplus._M_p);
LAB_00137a31:
  local_f0 = &local_e0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_e0 = *puVar1;
    uStack_d8 = puVar5[3];
  }
  else {
    local_e0 = *puVar1;
    local_f0 = (undefined8 *)*puVar5;
  }
  local_e8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_f0);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(what_arg->_M_dataplus)._M_p);
  plVar7 = plVar4 + 2;
  if ((long *)*plVar4 == plVar7) {
    local_a0 = *plVar7;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar7;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  sVar3 = pos->chars_read_total;
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_b0);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_002b16b0;
  __return_storage_ptr__->byte = sVar3;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, const position_t& pos, const std::string& what_arg)
    {
        std::string w = exception::name("parse_error", id_) + "parse error" +
                        position_string(pos) + ": " + what_arg;
        return parse_error(id_, pos.chars_read_total, w.c_str());
    }